

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::MakeCidentifier(string *s)

{
  long lVar1;
  undefined1 *puVar2;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string permited_chars;
  string *str;
  allocator local_69;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  lVar1 = std::__cxx11::string::find_first_of((char *)in_RDI,0x1e6f28);
  if (lVar1 == 0) {
    std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::operator=((string *)in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  while( true ) {
    lVar1 = std::__cxx11::string::find_first_not_of((string *)in_RDI,(ulong)local_68);
    if (lVar1 == -1) break;
    puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *puVar2 = 0x5f;
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_68);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::MakeCidentifier(const std::string& s)
{
  std::string str(s);
  if (str.find_first_of("0123456789") == 0) {
    str = "_" + str;
  }

  std::string permited_chars("_"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             "0123456789");
  std::string::size_type pos = 0;
  while ((pos = str.find_first_not_of(permited_chars, pos)) !=
         std::string::npos) {
    str[pos] = '_';
  }
  return str;
}